

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::rp_hsol_sol(HDual *this,HModel *ptr_model)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int *piVar6;
  int iVar7;
  long in_RDI;
  int vr_n_1;
  int r_n;
  int vr_n;
  int c_n;
  int *nonbasicFlag;
  double *rowUpper;
  double *rowLower;
  double *colUpper;
  double *colLower;
  double *colCost;
  uint local_4c;
  uint local_44;
  
  pdVar1 = HModel::getcolCost((HModel *)0x14b420);
  pdVar2 = HModel::getcolLower((HModel *)0x14b435);
  pdVar3 = HModel::getcolUpper((HModel *)0x14b44a);
  pdVar4 = HModel::getrowLower((HModel *)0x14b45f);
  pdVar5 = HModel::getrowUpper((HModel *)0x14b474);
  piVar6 = HModel::getNonbasicFlag((HModel *)0x14b489);
  printf(" Column      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd        Cost\n");
  for (local_44 = 0; (int)local_44 < *(int *)(in_RDI + 0x78); local_44 = local_44 + 1) {
    printf("%7d %11.4g %11.4g %7d %11.4g %11.4g %11.4g\n",
           *(undefined8 *)(*(long *)(in_RDI + 200) + (long)(int)local_44 * 8),
           *(undefined8 *)(*(long *)(in_RDI + 0xc0) + (long)(int)local_44 * 8),pdVar2[(int)local_44]
           ,pdVar3[(int)local_44],pdVar1[(int)local_44],(ulong)local_44,
           (ulong)(uint)piVar6[(int)local_44]);
  }
  printf("    Row      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd\n");
  for (local_4c = 0; (int)local_4c < *(int *)(in_RDI + 0x7c); local_4c = local_4c + 1) {
    iVar7 = *(int *)(in_RDI + 0x78) + local_4c;
    printf("%7d %11.4g %11.4g %7d %11.4g %11.4g\n",
           *(undefined8 *)(*(long *)(in_RDI + 200) + (long)iVar7 * 8),
           *(undefined8 *)(*(long *)(in_RDI + 0xc0) + (long)iVar7 * 8),pdVar4[(int)local_4c],
           pdVar5[(int)local_4c],(ulong)local_4c,(ulong)(uint)piVar6[iVar7]);
  }
  return;
}

Assistant:

void HDual::rp_hsol_sol(HModel *ptr_model) {
	const double *colCost = model->getcolCost();
	const double *colLower = model->getcolLower();
	const double *colUpper = model->getcolUpper();
	const double *rowLower = model->getrowLower();
	const double *rowUpper = model->getrowUpper();
	const int *nonbasicFlag = model->getNonbasicFlag();
	printf(" Column      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd        Cost\n");
	for (int c_n = 0; c_n < numCol; c_n++) {
		int vr_n = c_n;
		printf("%7d %11.4g %11.4g %7d %11.4g %11.4g %11.4g\n", c_n, workValue[vr_n], workDual[vr_n], nonbasicFlag[vr_n], colLower[c_n], colUpper[c_n], colCost[c_n]);
	}
	printf("    Row      Pr Act      Du Act   NonBc    Lower Bd    Upper Bd\n");
	for (int r_n = 0; r_n < numRow; r_n++) {
		int vr_n = numCol+r_n;
		printf("%7d %11.4g %11.4g %7d %11.4g %11.4g\n", r_n, workValue[vr_n], workDual[vr_n], nonbasicFlag[vr_n], rowLower[r_n], rowUpper[r_n]);
	}

}